

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1,uint64_t range_start,uint64_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  _Bool _Var4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  array_container_t *arr;
  run_container_t *prVar8;
  uint64_t uVar9;
  uint16_t lb_end;
  long lVar10;
  uint16_t hb;
  uint uVar11;
  run_container_t *c;
  uint16_t lb_start;
  long lVar12;
  ushort key;
  uint8_t type;
  ulong uVar13;
  bool bVar14;
  uint8_t local_4b;
  uint16_t local_4a;
  run_container_t *local_48;
  uint local_40;
  uint local_3c;
  ulong local_38;
  
  if (range_end <= range_start) {
    return;
  }
  uVar9 = 0;
  if (range_end < 0x100000000) {
    uVar9 = range_end;
  }
  hb = (uint16_t)(range_start >> 0x10);
  uVar13 = uVar9 - 1;
  uVar11 = (uint)(uVar13 >> 0x10) & 0xffff;
  lb_end = (uint16_t)uVar13;
  lb_start = (uint16_t)range_start;
  if ((uint16_t)(uVar13 >> 0x10) != hb) {
    local_4a = lb_end;
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,0xffff);
      hb = hb + 1;
    }
    local_38 = uVar13 & 0xffff;
    uVar5 = uVar11 - (local_38 != 0xffff);
    local_40 = uVar11;
    if (hb <= (ushort)uVar5) {
      local_3c = uVar5 & 0xffff;
      uVar11 = (uint)hb;
      do {
        iVar7 = (x1->high_low_container).size;
        key = (ushort)uVar11;
        if (((long)iVar7 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar7 + -1] == key)) {
          uVar5 = iVar7 - 1;
LAB_0011b264:
          if ((int)uVar5 < 0) goto LAB_0011b430;
LAB_0011b26d:
          local_4b = (x1->high_low_container).typecodes[uVar5 & 0xffff];
          arr = (array_container_t *)(x1->high_low_container).containers[uVar5 & 0xffff];
          if (local_4b == '\x04') {
            arr = (array_container_t *)
                  shared_container_extract_copy((shared_container_t *)arr,&local_4b);
          }
          local_48 = (run_container_t *)0x0;
          if (local_4b == '\x03') {
            uVar6 = run_container_negation_range_inplace((run_container_t *)arr,0,0x10000,&local_48)
            ;
            prVar8 = local_48;
            if ((char)uVar6 != '\x04') goto LAB_0011b3a3;
            uVar6 = (uint)*(byte *)&local_48->runs;
            if (*(byte *)&local_48->runs == 4) {
              __assert_fail("*type != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1062,
                            "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                           );
            }
            prVar8 = *(run_container_t **)local_48;
            type = '\x04';
            c = local_48;
          }
          else {
            if (local_4b == '\x02') {
              prVar8 = (run_container_t *)bitset_container_create();
              memset(prVar8->runs,0xff,0x2000);
              uVar9 = bitset_clear_list((uint64_t *)prVar8->runs,0x10000,arr->array,
                                        (long)arr->cardinality);
              prVar8->n_runs = (int32_t)uVar9;
              array_container_free(arr);
              uVar6 = 1;
            }
            else {
              if (local_4b != '\x01') {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                              ,0x186b,
                              "container_t *container_inot(container_t *, uint8_t, uint8_t *)");
              }
              _Var4 = bitset_container_negation_range_inplace
                                ((bitset_container_t *)arr,0,0x10000,&local_48);
              uVar6 = (uint)(byte)(2 - _Var4);
              prVar8 = local_48;
            }
LAB_0011b3a3:
            type = (uint8_t)uVar6;
            c = prVar8;
          }
          if ((char)uVar6 == '\x03') {
            lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
            if ((*(uint *)(lVar10 + 4) & 0x20) == 0) {
              iVar7 = prVar8->n_runs;
              lVar10 = (long)iVar7;
              if (0 < lVar10) {
                lVar12 = 0;
                do {
                  iVar7 = iVar7 + (uint)prVar8->runs[lVar12].length;
                  lVar12 = lVar12 + 1;
                } while (lVar10 != lVar12);
              }
            }
            else {
              iVar7 = _avx2_run_container_cardinality(prVar8);
            }
          }
          else {
            if (((uVar6 & 0xff) != 2) && ((uVar6 & 0xff) != 1)) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
            }
            iVar7 = prVar8->n_runs;
          }
          if (iVar7 == 0) {
            container_free(c,type);
            ra_remove_at_index(&x1->high_low_container,uVar5);
          }
          else {
            if ((x1->high_low_container).size <= (int)uVar5) {
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a3a,
                            "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                           );
            }
            (x1->high_low_container).containers[uVar5] = c;
            (x1->high_low_container).typecodes[uVar5] = type;
          }
        }
        else {
          if (0 < iVar7) {
            iVar7 = iVar7 + -1;
            uVar6 = 0;
            do {
              uVar5 = iVar7 + uVar6 >> 1;
              uVar1 = *(ushort *)((long)puVar2 + (ulong)(iVar7 + uVar6 & 0xfffffffe));
              if (uVar1 < key) {
                uVar6 = uVar5 + 1;
              }
              else {
                if (uVar1 <= key) goto LAB_0011b26d;
                iVar7 = uVar5 - 1;
              }
            } while ((int)uVar6 <= iVar7);
            uVar5 = ~uVar6;
            goto LAB_0011b264;
          }
          uVar5 = 0xffffffff;
LAB_0011b430:
          prVar8 = run_container_create_given_capacity(1);
          if (prVar8 != (run_container_t *)0x0) {
            prVar3 = prVar8->runs;
            iVar7 = prVar8->n_runs;
            prVar3[iVar7].value = 0;
            prVar3[iVar7].length = 0xffff;
            prVar8->n_runs = iVar7 + 1;
          }
          ra_insert_new_key_value_at(&x1->high_low_container,~uVar5,key,prVar8,'\x03');
        }
        bVar14 = uVar11 != local_3c;
        uVar11 = uVar11 + 1;
      } while (bVar14);
    }
    if ((int)local_38 == 0xffff) {
      return;
    }
    lb_start = 0;
    hb = (uint16_t)local_40;
    lb_end = local_4a;
  }
  inplace_flip_container(&x1->high_low_container,hb,lb_start,lb_end);
  return;
}

Assistant:

void roaring_bitmap_flip_inplace(roaring_bitmap_t *x1, uint64_t range_start,
                                 uint64_t range_end) {
    if (range_start >= range_end) {
        return;  // empty range
    }
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)((range_end - 1) >> 16);
    const uint16_t lb_end = (uint16_t)(range_end - 1);

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}